

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Mem * out2PrereleaseWithClear(Mem *pOut)

{
  if ((pOut->flags & 0x2400) != 0) {
    vdbeMemClearExternAndSetNull(pOut);
  }
  pOut->flags = 4;
  return pOut;
}

Assistant:

static SQLITE_NOINLINE Mem *out2PrereleaseWithClear(Mem *pOut){
  sqlite3VdbeMemSetNull(pOut);
  pOut->flags = MEM_Int;
  return pOut;
}